

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_fixed.c
# Opt level: O2

void calc_dim_arithmetic_fixed16
               (rt_variable_t *output,rt_variable_t *input1,rt_variable_t *input2,int dim_index,
               int y_out,int y_in1,int y_in2,_func_int16_t_int16_t_int16_t *calc_func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int16_t iVar6;
  int y_in2_00;
  ulong uVar7;
  uint uVar8;
  int y_in1_00;
  ulong uVar9;
  
  iVar1 = (output->shape).size;
  uVar2 = (output->shape).data[dim_index];
  iVar3 = (input1->shape).data[dim_index];
  iVar4 = (input2->shape).data[dim_index];
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    uVar8 = (int)uVar9 >> 0x1f;
    y_in1_00 = (int)((long)((ulong)uVar8 << 0x20 | uVar9 & 0xffffffff) % (long)iVar3) +
               y_in1 * iVar3;
    y_in2_00 = (int)((long)((ulong)uVar8 << 0x20 | uVar9 & 0xffffffff) % (long)iVar4) +
               y_in2 * iVar4;
    if (dim_index + 1 < iVar1) {
      calc_dim_arithmetic_fixed16
                (output,input1,input2,dim_index + 1,y_out * uVar2 + (int)uVar9,y_in1_00,y_in2_00,
                 calc_func);
    }
    else {
      pvVar5 = output->data;
      iVar6 = (*calc_func)(*(int16_t *)((long)input1->data + (long)y_in1_00 * 2),
                           *(int16_t *)((long)input2->data + (long)y_in2_00 * 2));
      *(int16_t *)((long)pvVar5 + uVar9 * 2 + (long)(int)(y_out * uVar2) * 2) = iVar6;
    }
  }
  return;
}

Assistant:

void calc_dim_arithmetic_fixed16(rt_variable_t *output, rt_variable_t *input1,
                                 rt_variable_t *input2, int dim_index,
                                 int y_out, int y_in1, int y_in2,
                                 int16_t (*calc_func)(int16_t, int16_t)) {
  int dim_size = output->shape.size;
  int x_size_out = output->shape.data[dim_index];
  int x_size_in1 = input1->shape.data[dim_index];
  int x_size_in2 = input2->shape.data[dim_index];
  for (int x_out = 0; x_out < x_size_out; x_out++) {
    int x_in1 = (x_out % x_size_in1);
    int x_in2 = (x_out % x_size_in2);
    int z_out = y_out * x_size_out + x_out;
    int z_in1 = y_in1 * x_size_in1 + x_in1;
    int z_in2 = y_in2 * x_size_in2 + x_in2;
    if (dim_index + 1 < dim_size) {
      calc_dim_arithmetic_fixed16(output, input1, input2, dim_index + 1, z_out,
                                  z_in1, z_in2, calc_func);
    } else {
      int16_t *data_out = output->data;
      int16_t *data_in1 = input1->data;
      int16_t *data_in2 = input2->data;
      data_out[z_out] = calc_func(data_in1[z_in1], data_in2[z_in2]);
    }
  }
}